

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O2

void makeIntColumns(Matrix<Complex> *m)

{
  uint uVar1;
  Complex *pCVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint local_1a8;
  BigInteger local_190;
  BigInteger g;
  BigInteger local_150;
  Complex local_130;
  BigInteger local_b0;
  BigInteger local_90;
  BigInteger local_70;
  BigInteger local_50;
  
  uVar7 = 0;
  do {
    if (m->N <= uVar7) {
      return;
    }
    BigInteger::BigInteger(&g,1);
    uVar5 = 0;
    local_1a8 = 0;
    for (uVar6 = 0; uVar6 < m->M; uVar6 = uVar6 + 1) {
      BigInteger::BigInteger
                ((BigInteger *)&local_130,&m->arr[m->N * uVar6 + uVar7]._re._denominator);
      BigInteger::BigInteger(&local_190,1);
      bVar3 = operator!=((BigInteger *)&local_130,&local_190);
      if (bVar3) {
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_190);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_130);
LAB_0011fc58:
        Complex::denominator((BigInteger *)&local_130,m->arr + m->N * uVar6 + uVar7);
        BigInteger::BigInteger(&local_150,&g);
        Complex::denominator(&local_b0,m->arr + m->N * uVar6 + uVar7);
        gcd(&local_190,&local_150,&local_b0);
        operator/(&local_90,(BigInteger *)&local_130,&local_190);
        BigInteger::operator*=(&g,&local_90);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_90);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_190);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b0);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_150);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_130);
      }
      else {
        BigInteger::BigInteger(&local_50,&m->arr[m->N * uVar6 + uVar7]._im._denominator);
        BigInteger::BigInteger(&local_70,1);
        bVar3 = operator!=(&local_50,&local_70);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_190);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_130);
        if (bVar3) goto LAB_0011fc58;
      }
      pCVar2 = m->arr;
      uVar1 = m->N;
      Complex::Complex(&local_130,0);
      bVar3 = Complex::operator<(&local_130,pCVar2 + uVar7 + uVar1 * uVar6);
      Complex::~Complex(&local_130);
      pCVar2 = m->arr;
      uVar1 = m->N;
      Complex::Complex(&local_130,0);
      bVar4 = Complex::operator<(pCVar2 + uVar7 + uVar1 * uVar6,&local_130);
      uVar5 = uVar5 + bVar3;
      local_1a8 = local_1a8 + bVar4;
      Complex::~Complex(&local_130);
    }
    if (uVar5 < local_1a8) {
      BigInteger::operator-((BigInteger *)&local_130,&g);
      BigInteger::operator=(&g,(BigInteger *)&local_130);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_130);
    }
    for (uVar5 = 0; uVar5 < m->M; uVar5 = uVar5 + 1) {
      Complex::Complex(&local_130,&g);
      Complex::operator*=(m->arr + m->N * uVar5 + uVar7,&local_130);
      Complex::~Complex(&local_130);
    }
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&g);
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void makeIntColumns(Matrix<Complex> &m)
{
    for(unsigned col = 0; col < m.width(); ++col)
    {
        BigInteger g = 1;
        unsigned pos = 0, neg = 0;
        for(unsigned i = 0; i < m.height(); ++i)
        {
            if(m[i][col].re().denominator() != 1 || m[i][col].im().denominator() != 1)
            {
                g *= m[i][col].denominator() / gcd(g, m[i][col].denominator());
            }
            pos += m[i][col] > 0;
            neg += m[i][col] < 0;
        }
        if(neg > pos)
            g = -g;
        for(unsigned i = 0; i < m.height(); ++i)
        {
            m[i][col] *= g;
        }
    }
}